

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O3

GetAddressInfoResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::GetAddressInfoRequestStruct,cfd::js::api::GetAddressInfoResponseStruct>
          (GetAddressInfoResponseStruct *__return_storage_ptr__,api *this,
          GetAddressInfoRequestStruct *request,
          function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
          *call_function,string *fuction_name)

{
  CfdException *cfde;
  long *plVar1;
  undefined1 auVar2 [12];
  anon_enum_32 local_18c;
  CfdException local_188;
  undefined1 local_158 [32];
  string local_138 [32];
  string local_118 [32];
  int32_t local_f8;
  string local_f0 [32];
  int local_d0;
  string asStack_c8 [32];
  string asStack_a8 [40];
  _Rb_tree_node_base local_80;
  size_t local_60;
  _Rb_tree_node_base local_50;
  size_t local_30;
  
  GetAddressInfoResponseStruct::GetAddressInfoResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  if ((request->address).field_2._M_allocated_capacity == 0) {
    auVar2 = std::__throw_bad_function_call();
    if (auVar2._8_4_ == 3) {
      cfde = (CfdException *)__cxa_begin_catch(auVar2._0_8_);
      local_158._0_8_ = "cfdjs_internal.h";
      local_158._8_4_ = 0x32;
      local_158._16_8_ = "ExecuteStructApi";
      local_18c = (**(code **)(*(long *)cfde + 0x18))(cfde);
      local_188._0_8_ = (**(code **)(*(long *)cfde + 0x10))(cfde);
      core::logger::log<std::__cxx11::string&,cfd::core::CfdError&,char_const*&>
                ((CfdSourceLocation *)local_158,kCfdLogLevelWarning,
                 "Failed to {}. CfdException occurred:  code={}, message={}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)call_function,
                 &local_18c,(char **)&local_188);
      ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_158,cfde);
      InnerErrorResponseStruct::operator=
                (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_158);
      InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_158);
      __cxa_end_catch();
    }
    else {
      plVar1 = (long *)__cxa_begin_catch(auVar2._0_8_);
      if (auVar2._8_4_ == 2) {
        local_158._0_8_ = "cfdjs_internal.h";
        local_158._8_4_ = 0x38;
        local_158._16_8_ = "ExecuteStructApi";
        local_188._0_8_ = (**(code **)(*plVar1 + 0x10))(plVar1);
        core::logger::log<std::__cxx11::string&,char_const*&>
                  ((CfdSourceLocation *)local_158,kCfdLogLevelWarning,
                   "Failed to {}. Exception occurred: message={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function,(char **)&local_188);
        core::CfdException::CfdException(&local_188);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_158,&local_188);
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_158);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_158);
        core::CfdException::~CfdException(&local_188);
        __cxa_end_catch();
      }
      else {
        local_158._0_8_ = "cfdjs_internal.h";
        local_158._8_4_ = 0x3d;
        local_158._16_8_ = "ExecuteStructApi";
        core::logger::log<std::__cxx11::string&>
                  ((CfdSourceLocation *)local_158,kCfdLogLevelWarning,
                   "Failed to {}. Unknown exception occurred.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function);
        core::CfdException::CfdException(&local_188);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_158,&local_188);
        InnerErrorResponseStruct::operator=
                  (&__return_storage_ptr__->error,(InnerErrorResponseStruct *)local_158);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_158);
        core::CfdException::~CfdException(&local_188);
        __cxa_end_catch();
      }
    }
  }
  else {
    (**(code **)((long)&(request->address).field_2 + 8))((string *)local_158,request,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_158);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->network,local_138);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash_type,local_118);
    __return_storage_ptr__->witness_version = local_f8;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash,local_f0);
    (__return_storage_ptr__->error).code = local_d0;
    std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).type,asStack_c8);
    std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->error).message,asStack_a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
    if (local_80._M_parent != (_Base_ptr)0x0) {
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = local_80._M_color;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = local_80._M_parent;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = local_80._M_left;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = local_80._M_right;
      (local_80._M_parent)->_M_parent =
           &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header.
            _M_header;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count
           = local_60;
      local_80._M_parent = (_Base_ptr)0x0;
      local_60 = 0;
      local_80._M_left = &local_80;
      local_80._M_right = &local_80;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
    if (local_50._M_parent != (_Base_ptr)0x0) {
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_50._M_color;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = local_50._M_parent;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_50._M_left;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_50._M_right;
      (local_50._M_parent)->_M_parent =
           &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_30;
      local_50._M_parent = (_Base_ptr)0x0;
      local_30 = 0;
      local_50._M_left = &local_50;
      local_50._M_right = &local_50;
    }
    GetAddressInfoResponseStruct::~GetAddressInfoResponseStruct
              ((GetAddressInfoResponseStruct *)local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}